

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>::
UntypedPerformAction
          (FunctionMocker<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>
           *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<ot::commissioner::Error> *pAVar1;
  ArgumentTuple *args;
  Action<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)> action;
  void *untyped_args_local;
  void *untyped_action_local;
  FunctionMocker<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>
  *this_local;
  
  action.fun_._M_invoker = (_Invoker_type)untyped_args;
  Action<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>::Action
            ((Action<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)> *)
             &args,(Action<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>
                    *)untyped_action);
  pAVar1 = ActionResultHolder<ot::commissioner::Error>::
           PerformAction<ot::commissioner::Error(unsigned_short&,ot::commissioner::JoinerType)>
                     ((Action<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>
                       *)&args,(ArgumentTuple *)action.fun_._M_invoker);
  Action<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>::~Action
            ((Action<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)> *)
             &args);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }